

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::TiledFaceBase::~TiledFaceBase(TiledFaceBase *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  
  (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFaceBase_02eec790;
  ppFVar2 = (this->_tiles).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (this->_tiles).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar2 != ppFVar1) {
    do {
      if (*ppFVar2 != (FaceData *)0x0) {
        (*((*ppFVar2)->super_PtexFaceData)._vptr_PtexFaceData[1])();
        ppFVar1 = (this->_tiles).
                  super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar2 = ppFVar2 + 1;
    } while (ppFVar2 != ppFVar1);
    ppFVar2 = (this->_tiles).
              super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppFVar2 != (pointer)0x0) {
    operator_delete(ppFVar2,(long)(this->_tiles).
                                  super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar2
                   );
    return;
  }
  return;
}

Assistant:

virtual ~TiledFaceBase() {
            for (std::vector<FaceData*>::iterator i = _tiles.begin(); i != _tiles.end(); ++i) {
                if (*i) delete *i;
            }
        }